

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posixcrashhandler.cpp
# Opt level: O2

void __thiscall Debug::PosixCrashHandler::~PosixCrashHandler(PosixCrashHandler *this)

{
  free(this->m_stackMemory);
  free(this->m_demangleMemory);
  std::__cxx11::string::~string((string *)&this->m_backtraceFilePath);
  std::_Function_base::~_Function_base(&(this->m_backtraceCallback).super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)this);
  return;
}

Assistant:

PosixCrashHandler::~PosixCrashHandler() {
        free(m_stackMemory);
        free(m_demangleMemory);
    }